

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::PerspectiveCamera::We
          (PerspectiveCamera *this,Ray *ray,SampledWavelengths *lambda,Point2f *pRasterOut)

{
  undefined8 uVar1;
  Point2<float> pt;
  Vector3<float> w;
  Tuple3<pbrt::Vector3,_float> v;
  bool bVar2;
  undefined8 *in_RCX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  undefined1 auVar9 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  Vector3f VVar12;
  Point3f PVar13;
  Point3<float> PVar14;
  Bounds2f BVar15;
  Float lensArea;
  Transform *in_stack_00000030;
  Bounds2f sampleBounds;
  Tuple3<pbrt::Point3,_float> in_stack_00000048;
  Point3f pRaster;
  Point3f pCamera;
  Point3f pFocus;
  Float cosTheta;
  float in_stack_fffffffffffffe78;
  Float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  float local_178;
  float local_158;
  float in_stack_fffffffffffffeac;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffeb0;
  undefined8 local_140;
  undefined4 in_stack_fffffffffffffec8;
  Float in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  array<float,_4> local_10;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar11 [56];
  
  v = *(Tuple3<pbrt::Vector3,_float> *)(in_RSI + 0xc);
  Vector3<float>::Vector3
            ((Vector3<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0.0);
  auVar9 = ZEXT856(0);
  VVar12.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffecc;
  VVar12.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffec8;
  VVar12.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffed0;
  VVar12 = CameraBase::RenderFromCamera
                     ((CameraBase *)in_stack_fffffffffffffeb0,VVar12,in_stack_fffffffffffffeac);
  auVar4._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar9;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  w.super_Tuple3<pbrt::Vector3,_float>.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  w.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar1;
  w.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  fVar3 = Dot<float>((Vector3<float>)v,w);
  if (*(float *)(in_RDI + 0x5a0) < fVar3) {
    auVar9 = ZEXT856(0);
    PVar13 = Ray::operator()((Ray *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                             in_stack_fffffffffffffecc);
    auVar5._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar5._8_56_ = auVar9;
    vmovlpd_avx(auVar5._0_16_);
    auVar9 = ZEXT856(0);
    PVar13.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffffecc;
    PVar13.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffffec8;
    PVar13.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffed0;
    PVar13 = CameraBase::CameraFromRender
                       ((CameraBase *)in_stack_fffffffffffffeb0,PVar13,in_stack_fffffffffffffeac);
    auVar6._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar6._8_56_ = auVar9;
    vmovlpd_avx(auVar6._0_16_);
    auVar9 = ZEXT856(0);
    auVar11 = SUB6056((undefined1  [60])0x0,4);
    PVar14 = Transform::ApplyInverse<float>(in_stack_00000030,in_stack_00000048);
    auVar7._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    vmovlpd_avx(auVar7._0_16_);
    if (in_RCX != (undefined8 *)0x0) {
      auVar9 = (undefined1  [56])0x0;
      auVar11 = (undefined1  [56])0x0;
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      *in_RCX = local_140;
    }
    BVar15 = Film::SampleBounds((Film *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80
                                                ));
    auVar10._0_8_ = BVar15.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar10._8_56_ = auVar11;
    auVar8._0_8_ = BVar15.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar8._8_56_ = auVar9;
    vmovlpd_avx(auVar8._0_16_);
    vmovlpd_avx(auVar10._0_16_);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
    pt.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffeac;
    pt.super_Tuple2<pbrt::Point2,_float>.x = local_158;
    bVar2 = Inside<float>(pt,(Bounds2<float> *)&stack0xfffffffffffffeb0);
    if (bVar2) {
      if ((*(float *)(in_RDI + 0x580) != 0.0) || (NAN(*(float *)(in_RDI + 0x580)))) {
        local_178 = Sqr<float>(*(float *)(in_RDI + 0x580));
        local_178 = local_178 * 3.1415927;
      }
      else {
        local_178 = 1.0;
      }
      local_178 = *(float *)(in_RDI + 0x5a4) * local_178;
      Pow<4>(local_178);
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(local_178,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe7c);
    }
    else {
      SampledSpectrum::SampledSpectrum
                ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe7c);
    }
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe7c);
  }
  return (array<float,_4>)(array<float,_4>)local_10.values;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum PerspectiveCamera::We(const Ray &ray, SampledWavelengths &lambda,
                                      Point2f *pRasterOut) const {
    // Check if ray is forward-facing with respect to the camera
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth)
        return SampledSpectrum(0.);

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return raster position if requested
    if (pRasterOut)
        *pRasterOut = Point2f(pRaster.x, pRaster.y);

    // Return zero importance for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds))
        return SampledSpectrum(0.);

    // Compute lens area of perspective camera
    Float lensArea = lensRadius != 0 ? (Pi * Sqr(lensRadius)) : 1;

    // Return importance for point on image plane
    return SampledSpectrum(1 / (A * lensArea * Pow<4>(cosTheta)));
}